

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineDeviceComputer.cxx
# Opt level: O0

bool cmLinkItemValidForDevice(string *item)

{
  bool bVar1;
  bool local_11;
  string *item_local;
  
  bVar1 = cmHasLiteralPrefix<std::__cxx11::string,2ul>(item,(char (*) [2])0x813aa4);
  local_11 = true;
  if (bVar1) {
    bVar1 = cmHasLiteralPrefix<std::__cxx11::string,3ul>(item,(char (*) [3])0x81f60c);
    local_11 = true;
    if (!bVar1) {
      bVar1 = cmHasLiteralPrefix<std::__cxx11::string,3ul>(item,(char (*) [3])"-L");
      local_11 = true;
      if (!bVar1) {
        local_11 = cmHasLiteralPrefix<std::__cxx11::string,10ul>(item,(char (*) [10])"--library");
      }
    }
  }
  return local_11;
}

Assistant:

static bool cmLinkItemValidForDevice(std::string const& item)
{
  // Valid items are:
  // * Non-flags (does not start in '-')
  // * Specific flags --library, --library-path, -l, -L
  // For example:
  // * 'cublas_device' => pass-along
  // * '--library pthread' => pass-along
  // * '-lpthread' => pass-along
  // * '-pthread' => drop
  // * '-a' => drop
  // * '-framework Name' (as one string) => drop
  return (!cmHasLiteralPrefix(item, "-") || //
          cmHasLiteralPrefix(item, "-l") || //
          cmHasLiteralPrefix(item, "-L") || //
          cmHasLiteralPrefix(item, "--library"));
}